

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_cast(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  class_spell_conflict *pcVar3;
  char *noun;
  char *verb;
  class_spell *spell;
  wchar_t dir;
  wchar_t spell_index;
  command *cmd_local;
  
  spell._0_4_ = L'\0';
  _dir = (command_conflict *)cmd;
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)cmd);
  if (((_Var1) && (_Var1 = player_can_cast(player,true), _Var1)) &&
     (wVar2 = cmd_get_spell((command *)_dir,"spell",player,(int *)((long)&spell + 4),"cast",
                            obj_can_cast_from,"There are no spells you can cast.",spell_okay_to_cast
                            ,"That book has no spells that you can cast."), wVar2 == L'\0')) {
    pcVar3 = spell_by_index(player,spell._4_4_);
    if ((int)player->csp < pcVar3->smana) {
      msg("You do not have enough mana to %s this %s.",pcVar3->realm->verb,pcVar3->realm->spell_noun
         );
      event_signal(EVENT_INPUT_FLUSH);
      _Var1 = get_check("Attempt it anyway? ");
      if (!_Var1) {
        return;
      }
    }
    _Var1 = spell_needs_aim(spell._4_4_);
    if (_Var1) {
      wVar2 = cmd_get_target((command *)_dir,"target",(int *)&spell);
      if (wVar2 != L'\0') {
        return;
      }
      player_confuse_dir(player,(int *)&spell,false);
    }
    target_fix();
    _Var1 = spell_cast(spell._4_4_,(wchar_t)spell,_dir);
    if (_Var1) {
      if (player->timed[0x21] == 0) {
        player->upkeep->energy_use = (uint)z_info->move_energy;
      }
      else {
        player->upkeep->energy_use = ((uint)z_info->move_energy * 3) / 4;
      }
    }
    target_release();
  }
  return;
}

Assistant:

void do_cmd_cast(struct command *cmd)
{
	int spell_index, dir = 0;
	const struct class_spell *spell;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Check the player can cast spells at all */
	if (!player_can_cast(player, true))
		return;

	/* Get arguments */
	if (cmd_get_spell(cmd, "spell", player, &spell_index,
			/* Verb */ "cast",
			/* Book */ obj_can_cast_from,
			/* Book error */ "There are no spells you can cast.",
			/* Filter */ spell_okay_to_cast,
			/* Spell error */ "That book has no spells that you can cast.") != CMD_OK) {
		return;
	}

	/* Get the spell */
	spell = spell_by_index(player, spell_index);

	/* Verify "dangerous" spells */
	if (spell->smana > player->csp) {
		const char *verb = spell->realm->verb;
		const char *noun = spell->realm->spell_noun;

		/* Warning */
		msg("You do not have enough mana to %s this %s.", verb, noun);

		/* Flush input */
		event_signal(EVENT_INPUT_FLUSH);

		/* Verify */
		if (!get_check("Attempt it anyway? ")) return;
	}

	if (spell_needs_aim(spell_index)) {
		if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
			player_confuse_dir(player, &dir, false);
		else
			return;
	}

	/* Cast a spell */
	target_fix();
	if (spell_cast(spell_index, dir, cmd)) {
		if (player->timed[TMD_FASTCAST]) {
			player->upkeep->energy_use = (z_info->move_energy * 3) / 4;
		} else {
			player->upkeep->energy_use = z_info->move_energy;
		}
	}
	target_release();
}